

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_leap_mpi.cc
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  ret_t rVar4;
  int rank;
  int size;
  long in;
  long in_all;
  yarn2 ry;
  yarn2 rx;
  uint local_78;
  uint local_74;
  long local_70;
  double local_68;
  long local_60;
  undefined1 local_54 [4];
  undefined1 local_50 [8];
  yarn2 local_48;
  yarn2 local_38;
  
  MPI_Init(local_54,local_50);
  MPI_Comm_size(&ompi_mpi_comm_world,&local_74);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_78);
  trng::yarn2::yarn2(&local_38,trng::yarn2::LEcuyer1);
  trng::yarn2::yarn2(&local_48,trng::yarn2::LEcuyer1);
  trng::yarn2::split(&local_38,2,0);
  trng::yarn2::split(&local_48,2,1);
  trng::yarn2::split(&local_38,local_74,local_78);
  trng::yarn2::split(&local_48,local_74,local_78);
  local_70 = 0;
  lVar2 = (long)(int)local_78;
  if (lVar2 < 1000000) {
    lVar3 = 0;
    do {
      rVar4 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn2>::addin(&local_38);
      local_68 = rVar4 * 4.656612875245797e-10;
      rVar4 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn2>::addin(&local_48);
      if (local_68 * local_68 + rVar4 * 4.656612875245797e-10 * rVar4 * 4.656612875245797e-10 <= 1.0
         ) {
        lVar3 = lVar3 + 1;
        local_70 = lVar3;
      }
      lVar2 = lVar2 + (int)local_74;
    } while (lVar2 < 1000000);
  }
  MPI_Reduce(&local_70,&local_60,1,&ompi_mpi_long,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  if (local_78 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi = ",5);
    poVar1 = std::ostream::_M_insert<double>(((double)local_60 * 4.0) / 1000000.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  const long samples{1000000l};  // total number of points in square
  MPI_Init(&argc, &argv);        // initialize MPI environment
  int size, rank;
  MPI_Comm_size(MPI_COMM_WORLD, &size);  // get total number of processes
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);  // get rank of current process
  trng::yarn2 rx, ry;                    // random number engines for x- and y-coordinates
  // split PRN sequences by leapfrog method
  rx.split(2, 0);            // choose sub-stream no. 0 out of 2 streams
  ry.split(2, 1);            // choose sub-stream no. 1 out of 2 streams
  rx.split(size, rank);      // choose sub-stream no. rank out of size streams
  ry.split(size, rank);      // choose sub-stream no. rank out of size streams
  long in{0l};               // number of points in circle
  trng::uniform01_dist<> u;  // random number distribution
  // throw random points into square and distribute workload over all processes
  for (long i{rank}; i < samples; i += size) {
    const double x{u(rx)}, y{u(ry)};  // choose random x- and y-coordinates
    if (x * x + y * y <= 1.0)         // is point in circle?
      ++in;                           // increase counter
  }
  // calculate sum of all local variables 'in' and storre result in 'in_all' on process 0
  long in_all;
  MPI_Reduce(&in, &in_all, 1, MPI_LONG, MPI_SUM, 0, MPI_COMM_WORLD);
  if (rank == 0)  // print result
    std::cout << "pi = " << 4.0 * in_all / samples << std::endl;
  MPI_Finalize();  // quit MPI
  return EXIT_SUCCESS;
}